

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPFakeTransmitter::GetLocalHostName
          (RTPFakeTransmitter *this,uint8_t *buffer,size_t *bufferlength)

{
  uint uVar1;
  char *__s;
  bool bVar2;
  reference pbVar3;
  long lVar4;
  size_t sVar5;
  void *__src;
  reference puVar6;
  size_t sVar7;
  RTPMemoryManager *pRVar8;
  uint8_t *puVar9;
  bool local_149;
  iterator local_128;
  _List_const_iterator<unsigned_int> local_120;
  char local_118 [8];
  char str [16];
  int len;
  uint32_t ip_1;
  iterator local_f0;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  iterator local_e0;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  const_iterator it_1;
  bool found;
  allocator<char> local_b1;
  undefined1 local_b0 [8];
  string hname;
  undefined1 local_80;
  undefined1 uStack_7f;
  undefined1 uStack_7e;
  undefined1 uStack_7d;
  undefined1 local_7c;
  undefined1 local_7b;
  undefined1 local_7a;
  undefined1 local_79;
  uint32_t ip;
  uint8_t addr [4];
  hostent *he;
  _List_const_iterator<unsigned_int> local_68;
  iterator local_60;
  _List_const_iterator<unsigned_int> local_58;
  undefined1 local_50 [8];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hostnames;
  const_iterator it;
  size_t *bufferlength_local;
  uint8_t *buffer_local;
  RTPFakeTransmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    return -0x84;
  }
  if ((this->created & 1U) == 0) {
    return -0x83;
  }
  if (this->localhostname != (uint8_t *)0x0) goto LAB_0018d248;
  bVar2 = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->localIPs);
  if (bVar2) {
    return -0x7f;
  }
  std::_List_const_iterator<unsigned_int>::_List_const_iterator
            ((_List_const_iterator<unsigned_int> *)
             &hostnames.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_50);
  local_60._M_node =
       (_List_node_base *)
       std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->localIPs);
  std::_List_const_iterator<unsigned_int>::_List_const_iterator(&local_58,&local_60);
  hostnames.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = (size_t)local_58._M_node;
  while( true ) {
    he = (hostent *)
         std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->localIPs);
    std::_List_const_iterator<unsigned_int>::_List_const_iterator(&local_68,(iterator *)&he);
    bVar2 = std::operator!=((_Self *)&hostnames.
                                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl._M_node._M_size,&local_68);
    if (!bVar2) break;
    puVar6 = std::_List_const_iterator<unsigned_int>::operator*
                       ((_List_const_iterator<unsigned_int> *)
                        &hostnames.
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl._M_node._M_size);
    uVar1 = *puVar6;
    uStack_7d = (undefined1)(uVar1 >> 0x18);
    local_7c = uStack_7d;
    uStack_7e = (undefined1)(uVar1 >> 0x10);
    local_7b = uStack_7e;
    uStack_7f = (undefined1)(uVar1 >> 8);
    local_7a = uStack_7f;
    local_80 = (undefined1)uVar1;
    local_79 = local_80;
    _ip = gethostbyaddr(&local_7c,4,2);
    if (_ip != (hostent *)0x0) {
      __s = _ip->h_name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_b0,__s,&local_b1);
      std::allocator<char>::~allocator(&local_b1);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_50,(value_type *)local_b0);
      std::__cxx11::string::~string((string *)local_b0);
    }
    std::_List_const_iterator<unsigned_int>::operator++
              ((_List_const_iterator<unsigned_int> *)
               &hostnames.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size,0);
  }
  it_1._M_node._7_1_ = 0;
  bVar2 = std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_50);
  if (!bVar2) {
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_List_const_iterator(&local_d0);
    local_e0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_50);
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_List_const_iterator(&local_d8,&local_e0);
    local_d0._M_node = local_d8._M_node;
    while( true ) {
      local_149 = false;
      if ((it_1._M_node._7_1_ & 1) == 0) {
        local_f0._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_50);
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_List_const_iterator(&local_e8,&local_f0);
        local_149 = std::operator!=(&local_d0,&local_e8);
      }
      if (local_149 == false) break;
      pbVar3 = std::
               _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_d0);
      lVar4 = std::__cxx11::string::find((char)pbVar3,0x2e);
      if (lVar4 != -1) {
        it_1._M_node._7_1_ = 1;
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_d0);
        sVar5 = std::__cxx11::string::length();
        this->localhostnamelength = sVar5;
        sVar5 = this->localhostnamelength;
        pRVar8 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        puVar9 = (uint8_t *)operator_new__(sVar5 + 1,pRVar8,0);
        this->localhostname = puVar9;
        if (this->localhostname == (uint8_t *)0x0) {
          this_local._4_4_ = -1;
          bVar2 = true;
          goto LAB_0018d224;
        }
        puVar9 = this->localhostname;
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_d0);
        __src = (void *)std::__cxx11::string::c_str();
        memcpy(puVar9,__src,this->localhostnamelength);
        this->localhostname[this->localhostnamelength] = '\0';
      }
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_d0,0);
    }
  }
  if ((it_1._M_node._7_1_ & 1) == 0) {
    local_128._M_node =
         (_List_node_base *)
         std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->localIPs);
    std::_List_const_iterator<unsigned_int>::_List_const_iterator(&local_120,&local_128);
    hostnames.
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = (size_t)local_120._M_node;
    puVar6 = std::_List_const_iterator<unsigned_int>::operator*
                       ((_List_const_iterator<unsigned_int> *)
                        &hostnames.
                         super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl._M_node._M_size);
    str._12_4_ = *puVar6;
    snprintf(local_118,0x10,"%d.%d.%d.%d",(ulong)((uint)str._12_4_ >> 0x18),
             (ulong)((uint)str._12_4_ >> 0x10 & 0xff),(ulong)(byte)((uint)str._12_4_ >> 8),
             str._12_4_ & 0xff);
    sVar7 = strlen(local_118);
    str._8_4_ = (undefined4)sVar7;
    this->localhostnamelength = (long)(int)str._8_4_;
    sVar5 = this->localhostnamelength;
    pRVar8 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
    puVar9 = (uint8_t *)operator_new__(sVar5 + 1,pRVar8,0);
    this->localhostname = puVar9;
    if (this->localhostname != (uint8_t *)0x0) {
      memcpy(this->localhostname,local_118,this->localhostnamelength);
      this->localhostname[this->localhostnamelength] = '\0';
      goto LAB_0018d21a;
    }
    this_local._4_4_ = -1;
    bVar2 = true;
  }
  else {
LAB_0018d21a:
    bVar2 = false;
  }
LAB_0018d224:
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_50);
  if (bVar2) {
    return this_local._4_4_;
  }
LAB_0018d248:
  if (*bufferlength < this->localhostnamelength) {
    *bufferlength = this->localhostnamelength;
    this_local._4_4_ = -0x45;
  }
  else {
    memcpy(buffer,this->localhostname,this->localhostnamelength);
    *bufferlength = this->localhostnamelength;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int RTPFakeTransmitter::GetLocalHostName(uint8_t *buffer,size_t *bufferlength)
{
	if (!init)
		return ERR_RTP_FAKETRANS_NOTINIT;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_NOTCREATED;
	}

	if (localhostname == 0)
	{
		if (localIPs.empty())
		{
			MAINMUTEX_UNLOCK
			return ERR_RTP_FAKETRANS_NOLOCALIPS;
		}
		
		std::list<uint32_t>::const_iterator it;
		std::list<std::string> hostnames;
	
		for (it = localIPs.begin() ; it != localIPs.end() ; it++)
		{
			struct hostent *he;
			uint8_t addr[4];
			uint32_t ip = (*it);
	
			addr[0] = (uint8_t)((ip>>24)&0xFF);
			addr[1] = (uint8_t)((ip>>16)&0xFF);
			addr[2] = (uint8_t)((ip>>8)&0xFF);
			addr[3] = (uint8_t)(ip&0xFF);
			he = gethostbyaddr((char *)addr,4,AF_INET);
			if (he != 0)
			{
				std::string hname = std::string(he->h_name);
				hostnames.push_back(hname);
			}
		}
	
		bool found  = false;
		
		if (!hostnames.empty())	// try to select the most appropriate hostname
		{
			std::list<std::string>::const_iterator it;
			
			for (it = hostnames.begin() ; !found && it != hostnames.end() ; it++)
			{
				if ((*it).find('.') != std::string::npos)
				{
					found = true;
					localhostnamelength = (*it).length();
					localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength+1];
					if (localhostname == 0)
					{
						MAINMUTEX_UNLOCK
						return ERR_RTP_OUTOFMEM;
					}
					memcpy(localhostname,(*it).c_str(),localhostnamelength);
					localhostname[localhostnamelength] = 0;
				}
			}
		}
	
		if (!found) // use an IP address
		{
			uint32_t ip;
			int len;
			char str[16];
			
			it = localIPs.begin();
			ip = (*it);
			
			snprintf(str,16,"%d.%d.%d.%d",(int)((ip>>24)&0xFF),(int)((ip>>16)&0xFF),(int)((ip>>8)&0xFF),(int)(ip&0xFF));
			len = strlen(str);
	
			localhostnamelength = len;
			localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength + 1];
			if (localhostname == 0)
			{
				MAINMUTEX_UNLOCK
				return ERR_RTP_OUTOFMEM;
			}
			memcpy(localhostname,str,localhostnamelength);
			localhostname[localhostnamelength] = 0;
		}
	}
	
	if ((*bufferlength) < localhostnamelength)
	{
		*bufferlength = localhostnamelength; // tell the application the required size of the buffer
		MAINMUTEX_UNLOCK
		return ERR_RTP_TRANS_BUFFERLENGTHTOOSMALL;
	}

	memcpy(buffer,localhostname,localhostnamelength);
	*bufferlength = localhostnamelength;
	
	MAINMUTEX_UNLOCK
	return 0;
}